

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::selectAll(QAbstractItemView *this)

{
  QFlags<QItemSelectionModel::SelectionFlag> QVar1;
  undefined4 uVar2;
  QAbstractItemViewPrivate *pQVar3;
  ulong uVar4;
  long *in_RDI;
  long in_FS_OFFSET;
  SelectionMode mode;
  QAbstractItemViewPrivate *d;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> in_stack_ffffffffffffff5c;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff60;
  QAbstractItemModel *pQVar5;
  QPersistentModelIndex local_50 [3];
  undefined1 local_38 [24];
  QPersistentModelIndex local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QAbstractItemView *)0x802890);
  switch(pQVar3->selectionMode) {
  case NoSelection:
  case ContiguousSelection:
    pQVar5 = pQVar3->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_20);
    uVar4 = (**(code **)(*(long *)pQVar5 + 0x88))(pQVar5,local_20);
    if ((uVar4 & 1) != 0) {
      pQVar5 = pQVar3->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_50);
      (**(code **)(*(long *)pQVar5 + 0x60))(local_38,pQVar5,0,0,local_50);
      uVar2 = (**(code **)(*in_RDI + 0x2e8))(in_RDI,local_38,0);
      (**(code **)(*(long *)&(pQVar3->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                             super_QWidgetPrivate + 0x118))(pQVar3,uVar2);
    }
    break;
  case SingleSelection:
    break;
  case MultiSelection:
  case ExtendedSelection:
    QAbstractItemViewPrivate::selectionBehaviorFlags(in_stack_ffffffffffffff60);
    QVar1 = ::operator|(NoUpdate,(QFlags<QItemSelectionModel::SelectionFlag>)
                                 in_stack_ffffffffffffff5c.i);
    (**(code **)(*(long *)&(pQVar3->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                           super_QWidgetPrivate + 0x118))
              (pQVar3,QVar1.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                      super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::selectAll()
{
    Q_D(QAbstractItemView);
    const SelectionMode mode = d->selectionMode;
    switch (mode) {
    case MultiSelection:
    case ExtendedSelection:
        d->selectAll(QItemSelectionModel::ClearAndSelect
                     | d->selectionBehaviorFlags());
        break;
    case NoSelection:
    case ContiguousSelection:
        if (d->model->hasChildren(d->root))
            d->selectAll(selectionCommand(d->model->index(0, 0, d->root)));
        break;
    case SingleSelection:
        break;
    }
}